

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

Configurator * __thiscall Clasp::ClaspConfig::Impl::ConfiguratorProxy::ptr(ConfiguratorProxy *this)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ulong *in_RDI;
  
  if (ptr()::ptrMask == '\0') {
    iVar1 = __cxa_guard_acquire(&ptr()::ptrMask);
    if (iVar1 != 0) {
      uVar2 = bit_mask<unsigned_long>(0x3e);
      uVar3 = bit_mask<unsigned_long>(0x3d);
      ptr::ptrMask = (uVar2 | uVar3) ^ 0xffffffffffffffff;
      __cxa_guard_release(&ptr()::ptrMask);
    }
  }
  return (Configurator *)(*in_RDI & ptr::ptrMask);
}

Assistant:

Configurator* ptr() const {
			static const uint64 ptrMask = ~(bit_mask<uint64>(OnceBit) | bit_mask<uint64>(AcquireBit));
			return reinterpret_cast<Configurator*>(static_cast<uintp>(cfg & ptrMask));
		}